

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CESkyCoord.cpp
# Opt level: O3

void CESkyCoord::Observed2CIRS
               (CESkyCoord *in_observed,CESkyCoord *out_cirs,CEDate *date,CEObserver *observer)

{
  int iVar1;
  sofa_error *this;
  double dVar2;
  undefined8 extraout_XMM0_Qa;
  CEAngle CVar3;
  double dec;
  double ra;
  allocator local_15b;
  allocator local_15a;
  allocator local_159;
  CEAngle local_158;
  double local_148;
  double local_140;
  double local_138;
  double local_130;
  double local_128;
  double local_120;
  double local_118;
  double local_110;
  double local_108;
  double local_100;
  double local_f8;
  undefined8 local_f0;
  double local_e8;
  double local_e0;
  double local_d8;
  string local_d0;
  CEDate local_b0;
  CEDate local_70;
  
  local_140 = 0.0;
  local_148 = 0.0;
  dVar2 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_70,dVar2,JD);
  (*in_observed->_vptr_CESkyCoord[3])(&local_d0,in_observed,&local_70);
  local_d8 = CEAngle::Rad((CEAngle *)&local_d0);
  dVar2 = CppEphem::julian_date_J2000();
  CEDate::CEDate(&local_b0,dVar2,JD);
  (*in_observed->_vptr_CESkyCoord[4])(&local_158,in_observed,&local_b0);
  local_e0 = CEAngle::Rad(&local_158);
  local_e8 = CEDate::GetMJD2JDFactor();
  (*date->_vptr_CEDate[5])(date);
  local_f0 = extraout_XMM0_Qa;
  local_f8 = CEDate::dut1(date);
  local_100 = CEObserver::Longitude_Rad(observer);
  local_108 = CEObserver::Latitude_Rad(observer);
  local_110 = CEObserver::Elevation_m(observer);
  local_118 = CEDate::xpolar(date);
  local_120 = CEDate::ypolar(date);
  local_128 = CEObserver::Pressure_hPa(observer);
  local_130 = CEObserver::Temperature_C(observer);
  local_138 = CEObserver::RelativeHumidity(observer);
  CEObserver::Wavelength_um(observer);
  iVar1 = iauAtoi13(local_d8,local_e0,local_e8,local_f0,local_f8,local_100,local_108,local_110,"A",
                    &local_140,&local_148);
  CEAngle::~CEAngle(&local_158);
  CEDate::~CEDate(&local_b0);
  CEAngle::~CEAngle((CEAngle *)&local_d0);
  CEDate::~CEDate(&local_70);
  if (iVar1 != -1) {
    CEAngle::Rad((CEAngle *)&local_70,&local_140);
    CVar3 = CEAngle::Rad((CEAngle *)&local_b0,&local_148);
    local_d0._M_dataplus._M_p._0_4_ = 0;
    (*out_cirs->_vptr_CESkyCoord[5])(CVar3.angle_,out_cirs,&local_70,&local_b0);
    CEAngle::~CEAngle((CEAngle *)&local_b0);
    CEAngle::~CEAngle((CEAngle *)&local_70);
    return;
  }
  this = (sofa_error *)__cxa_allocate_exception(0xa8);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_70,"CESkyCoord::CIRS2Observed",&local_15b);
  std::allocator<char>::allocator();
  std::__cxx11::string::string((string *)&local_b0,"iauAtio13",&local_159);
  local_158._vptr_CEAngle._0_4_ = 0xffffffff;
  std::allocator<char>::allocator();
  std::__cxx11::string::string
            ((string *)&local_d0,"SOFA method was passed an unacceptable date",&local_15a);
  CEException::sofa_error::sofa_error
            (this,(string *)&local_70,(string *)&local_b0,(int *)&local_158,&local_d0);
  __cxa_throw(this,&CEException::sofa_error::typeinfo,CEExceptionHandler::~CEExceptionHandler);
}

Assistant:

void CESkyCoord::Observed2CIRS(const CESkyCoord& in_observed,
                               CESkyCoord*       out_cirs,
                               const CEDate&     date,
                               const CEObserver& observer)
{
    // Preliminary coordinates
    double ra(0.0);
    double dec(0.0);

    // Run the SOFA method
    int err_code = iauAtoi13("A", 
                             in_observed.XCoord().Rad(), 
                             in_observed.YCoord().Rad(),
                             CEDate::GetMJD2JDFactor(), date.MJD(),
                             date.dut1(),
                             observer.Longitude_Rad(), 
                             observer.Latitude_Rad(),
                             observer.Elevation_m(),
                             date.xpolar(), date.ypolar(),
                             observer.Pressure_hPa(),
                             observer.Temperature_C(),
                             observer.RelativeHumidity(),
                             observer.Wavelength_um(),
                             &ra, &dec);

    // Handle unacceptable date
    if (err_code == -1) {
        throw CEException::sofa_error("CESkyCoord::CIRS2Observed",
                                      "iauAtio13", -1,
                                      "SOFA method was passed an unacceptable date");
    }

    // Set ICRS coordinates
    out_cirs->SetCoordinates(CEAngle::Rad(ra), CEAngle::Rad(dec),
                             CESkyCoordType::CIRS);

    return;
}